

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::SetCurrentLinkType(cmComputeLinkInformation *this,LinkType lt)

{
  ItemIsPath *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  ItemIsPath IStack_8;
  ItemIsPath local_4;
  
  __args_1 = &IStack_8;
  if ((this->CurrentLinkType != lt) && (this->CurrentLinkType = lt, this->LinkTypeEnabled == true))
  {
    if (lt == LinkShared) {
      __args = &this->SharedLinkTypeFlag;
    }
    else {
      if (lt != LinkStatic) {
        return;
      }
      __args = &this->StaticLinkTypeFlag;
      __args_1 = &local_4;
    }
    *__args_1 = No;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<std::__cxx11::string&,cmComputeLinkInformation::ItemIsPath>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,__args,__args_1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::SetCurrentLinkType(LinkType lt)
{
  // If we are changing the current link type add the flag to tell the
  // linker about it.
  if (this->CurrentLinkType != lt) {
    this->CurrentLinkType = lt;

    if (this->LinkTypeEnabled) {
      switch (this->CurrentLinkType) {
        case LinkStatic:
          this->Items.emplace_back(this->StaticLinkTypeFlag, ItemIsPath::No);
          break;
        case LinkShared:
          this->Items.emplace_back(this->SharedLinkTypeFlag, ItemIsPath::No);
          break;
        default:
          break;
      }
    }
  }
}